

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cc
# Opt level: O1

void __thiscall tt::net::EventLoop::handleRead(EventLoop *this)

{
  char *pcVar1;
  ssize_t v;
  LogStream *pLVar2;
  char **ppcVar3;
  Logger local_ff8;
  undefined8 local_20;
  uint64_t one;
  
  local_20 = 1;
  v = readn(this->m_wakeupFd,&local_20,8);
  if (v != 8) {
    Logger::Logger(&local_ff8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/EventLoop.cc"
                   ,0x65);
    if (0x1e < ((int)&local_ff8 + 0xfa8) - (int)local_ff8.m_impl.m_stream.m_buffer.m_cur) {
      builtin_strncpy(local_ff8.m_impl.m_stream.m_buffer.m_cur,"EventLoop::handleRead() reads ",0x1e
                     );
      local_ff8.m_impl.m_stream.m_buffer.m_cur = local_ff8.m_impl.m_stream.m_buffer.m_cur + 0x1e;
    }
    pLVar2 = LogStream::operator<<((LogStream *)&local_ff8,v);
    ppcVar3 = &(pLVar2->m_buffer).m_cur;
    pcVar1 = (pLVar2->m_buffer).m_cur;
    if (0x12 < (int)ppcVar3 - (int)pcVar1) {
      builtin_strncpy(pcVar1,"bytes instead of 8",0x12);
      *ppcVar3 = *ppcVar3 + 0x12;
    }
    Logger::~Logger(&local_ff8);
  }
  ((this->m_wakeupChannel).super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->m_events = 0x80000001;
  return;
}

Assistant:

void EventLoop::handleRead(){

	uint64_t one = 1;
	ssize_t n = readn(m_wakeupFd, &one, sizeof(one));

	if(n != sizeof(one)){
		LOG << "EventLoop::handleRead() reads " << n << "bytes instead of 8";
	}

	m_wakeupChannel->setEvents(EPOLLIN | EPOLLET);
}